

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O3

uint sad64x32(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  int iVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  iVar5 = 0x10;
  pauVar3 = (undefined1 (*) [32])src_ptr;
  pauVar4 = (undefined1 (*) [32])ref_ptr;
  do {
    auVar8 = vpsadbw_avx2(*pauVar4,*pauVar3);
    auVar8 = vpaddd_avx2(auVar6._0_32_,auVar8);
    auVar2 = vpsadbw_avx2(*(undefined1 (*) [32])(*pauVar4 + ref_stride),
                          *(undefined1 (*) [32])(*pauVar3 + src_stride));
    auVar8 = vpaddd_avx2(auVar8,auVar2);
    auVar6 = ZEXT3264(auVar8);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + ref_stride * 2);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride * 2);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  pauVar4 = (undefined1 (*) [32])(src_ptr + 0x20);
  pauVar3 = (undefined1 (*) [32])(ref_ptr + 0x20);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  iVar5 = 0x10;
  do {
    auVar2 = vpsadbw_avx2(*pauVar3,*pauVar4);
    auVar2 = vpaddd_avx2(auVar6._0_32_,auVar2);
    auVar7 = vpsadbw_avx2(*(undefined1 (*) [32])(*pauVar3 + ref_stride),
                          *(undefined1 (*) [32])(*pauVar4 + src_stride));
    auVar2 = vpaddd_avx2(auVar2,auVar7);
    auVar6 = ZEXT3264(auVar2);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + ref_stride * 2);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride * 2);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  auVar7 = vpsrldq_avx2(auVar8,8);
  auVar8 = vpaddd_avx2(auVar8,auVar7);
  auVar1 = vpaddd_avx(auVar8._16_16_,auVar8._0_16_);
  auVar8 = vpsrldq_avx2(auVar2,8);
  auVar8 = vpaddd_avx2(auVar2,auVar8);
  auVar1 = vpaddd_avx(auVar8._0_16_,auVar1);
  auVar1 = vpaddd_avx(auVar8._16_16_,auVar1);
  return auVar1._0_4_;
}

Assistant:

static unsigned int sad64x32(const uint8_t *src_ptr, int src_stride,
                             const uint8_t *ref_ptr, int ref_stride) {
  unsigned int half_width = 32;
  uint32_t sum = sad32x32(src_ptr, src_stride, ref_ptr, ref_stride);
  src_ptr += half_width;
  ref_ptr += half_width;
  sum += sad32x32(src_ptr, src_stride, ref_ptr, ref_stride);
  return sum;
}